

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall
capnp::JsonCodec::AnnotatedHandler::AnnotatedHandler
          (AnnotatedHandler *this,JsonCodec *codec,StructSchema schema,
          Maybe<capnp::json::DiscriminatorOptions::Reader> *discriminator,
          Maybe<kj::StringPtr> *unionDeclName,Vector<capnp::Schema> *dependencies)

{
  StringPtr key;
  bool bVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  Reader RVar4;
  Iterator IVar5;
  anon_class_40_5_590b9dd2 local_350;
  FieldList local_328;
  Mapper<capnp::StructSchema::FieldList> local_2f0;
  Array<capnp::JsonCodec::AnnotatedHandler::FieldInfo> local_2b8;
  Reader local_2a0;
  FieldNameInfo local_270;
  ArrayPtr<const_char> local_248;
  ArrayPtr<const_char> local_238;
  FieldNameInfo local_220;
  char *local_1f8;
  size_t sStack_1f0;
  StringPtr *local_1e8;
  StringPtr *u;
  StringPtr *_u975;
  size_t local_1d0;
  Reader *local_1c8;
  Reader *d;
  Reader *_d969;
  Reader local_188;
  ReaderFor<capnp::json::DiscriminatorOptions> local_168;
  undefined1 local_138 [8];
  Reader anno;
  undefined1 local_f8 [8];
  Iterator __end3;
  undefined1 local_d8 [8];
  Iterator __begin3;
  Reader *__range3;
  undefined1 local_88 [8];
  Reader typeName;
  Reader schemaProto;
  Vector<capnp::Schema> *dependencies_local;
  Maybe<kj::StringPtr> *unionDeclName_local;
  Maybe<capnp::json::DiscriminatorOptions::Reader> *discriminator_local;
  JsonCodec *codec_local;
  AnnotatedHandler *this_local;
  StructSchema schema_local;
  
  this_local = (AnnotatedHandler *)schema.super_Schema.raw;
  Handler<capnp::DynamicStruct,_(capnp::Style)2>::Handler
            (&this->super_Handler<capnp::DynamicStruct,_(capnp::Style)2>);
  (this->super_Handler<capnp::DynamicStruct,_(capnp::Style)2>).super_HandlerBase._vptr_HandlerBase =
       (_func_int **)&PTR_encodeBase_004c4128;
  (this->schema).super_Schema.raw = (RawBrandedSchema *)this_local;
  kj::Array<capnp::JsonCodec::AnnotatedHandler::FieldInfo>::Array(&this->fields);
  kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::HashMap
            (&this->fieldsByName);
  kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::HashMap(&this->unionTagValues);
  kj::Maybe<kj::StringPtr>::Maybe(&this->unionTagName);
  Schema::getProto((Reader *)&typeName.super_StringPtr.content.size_,(Schema *)&this_local);
  RVar4 = capnp::schema::Node::Reader::getDisplayName
                    ((Reader *)&typeName.super_StringPtr.content.size_);
  typeName.super_StringPtr.content.ptr = RVar4.super_StringPtr.content.size_;
  local_88 = RVar4.super_StringPtr.content.ptr;
  bVar1 = kj::Maybe<capnp::json::DiscriminatorOptions::Reader>::operator==(discriminator);
  if (bVar1) {
    capnp::schema::Node::Reader::getAnnotations
              ((Reader *)&__begin3.index,(Reader *)&typeName.super_StringPtr.content.size_);
    IVar5 = List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader::begin
                      ((Reader *)&__begin3.index);
    __end3._8_8_ = IVar5.container;
    __begin3.container._0_4_ = IVar5.index;
    local_d8 = (undefined1  [8])__end3._8_8_;
    IVar5 = List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader::end((Reader *)&__begin3.index);
    anno._reader._40_8_ = IVar5.container;
    __end3.container._0_4_ = IVar5.index;
    local_f8 = (undefined1  [8])anno._reader._40_8_;
    while (bVar1 = capnp::_::
                   IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
                   ::operator==((IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
                                 *)local_d8,
                                (IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
                                 *)local_f8), ((bVar1 ^ 0xffU) & 1) != 0) {
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
      ::operator*((Reader *)local_138,
                  (IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
                   *)local_d8);
      uVar3 = capnp::schema::Annotation::Reader::getId((Reader *)local_138);
      if (uVar3 == 0xcfa794e8d19a0162) {
        capnp::schema::Annotation::Reader::getValue((Reader *)&_d969,(Reader *)local_138);
        capnp::schema::Value::Reader::getStruct(&local_188,(Reader *)&_d969);
        AnyPointer::Reader::getAs<capnp::json::DiscriminatorOptions>(&local_168,&local_188);
        kj::Maybe<capnp::json::DiscriminatorOptions::Reader>::operator=(discriminator,&local_168);
      }
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
      ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
                    *)local_d8);
    }
  }
  d = kj::_::readMaybe<capnp::json::DiscriminatorOptions::Reader>(discriminator);
  if (d != (Reader *)0x0) {
    local_1c8 = d;
    bVar1 = json::DiscriminatorOptions::Reader::hasName(d);
    if (bVar1) {
      RVar4 = json::DiscriminatorOptions::Reader::getName(local_1c8);
      local_1d0 = RVar4.super_StringPtr.content.size_;
      _u975 = RVar4.super_StringPtr.content.ptr;
      kj::Maybe<kj::StringPtr>::operator=(&this->unionTagName,(StringPtr *)&_u975);
    }
    else {
      kj::Maybe<kj::StringPtr>::operator=(&this->unionTagName,unionDeclName);
    }
    u = kj::_::readMaybe<kj::StringPtr>(&this->unionTagName);
    if (u != (StringPtr *)0x0) {
      local_1f8 = (u->content).ptr;
      sStack_1f0 = (u->content).size_;
      local_220.type = UNION_TAG;
      local_220.index = 0;
      local_220.prefixLength = 0;
      local_1e8 = u;
      kj::String::String(&local_220.ownName,(void *)0x0);
      key.content.size_ = sStack_1f0;
      key.content.ptr = local_1f8;
      kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::insert
                (&this->fieldsByName,key,&local_220);
      FieldNameInfo::~FieldNameInfo(&local_220);
    }
    bVar1 = json::DiscriminatorOptions::Reader::hasValueName(local_1c8);
    if (bVar1) {
      local_248 = (ArrayPtr<const_char>)json::DiscriminatorOptions::Reader::getValueName(local_1c8);
      local_270.type = UNION_VALUE;
      local_270.index = 0;
      local_270.prefixLength = 0;
      local_238 = local_248;
      kj::String::String(&local_270.ownName,(void *)0x0);
      kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::insert
                (&this->fieldsByName,(StringPtr)local_238,&local_270);
      FieldNameInfo::~FieldNameInfo(&local_270);
    }
  }
  capnp::schema::Node::Reader::getStruct
            (&local_2a0,(Reader *)&typeName.super_StringPtr.content.size_);
  uVar2 = capnp::schema::Node::Struct::Reader::getDiscriminantOffset(&local_2a0);
  this->discriminantOffset = uVar2;
  StructSchema::getFields(&local_328,(StructSchema *)&this_local);
  kj::_::Mapper<capnp::StructSchema::FieldList>::Mapper(&local_2f0,&local_328);
  local_350.typeName = (Reader *)local_88;
  local_350.codec = codec;
  local_350.dependencies = dependencies;
  local_350.this = this;
  local_350.discriminator = discriminator;
  kj::_::Mapper<capnp::StructSchema::FieldList>::
  operator*<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compat_json_c__:990:14)>
            (&local_2b8,&local_2f0,&local_350);
  kj::Array<capnp::JsonCodec::AnnotatedHandler::FieldInfo>::operator=(&this->fields,&local_2b8);
  kj::Array<capnp::JsonCodec::AnnotatedHandler::FieldInfo>::~Array(&local_2b8);
  return;
}

Assistant:

AnnotatedHandler(JsonCodec& codec, StructSchema schema,
                   kj::Maybe<json::DiscriminatorOptions::Reader> discriminator,
                   kj::Maybe<kj::StringPtr> unionDeclName,
                   kj::Vector<Schema>& dependencies)
      : schema(schema) {
    auto schemaProto = schema.getProto();
    auto typeName = schemaProto.getDisplayName();

    if (discriminator == kj::none) {
      // There are two cases of unions:
      // * Named unions, which are special cases of named groups. In this case, the union may be
      //   annotated by annotating the field. In this case, we receive a non-null `discriminator`
      //   as a constructor parameter, and schemaProto.getAnnotations() must be empty because
      //   it's not possible to annotate a group's type (because the type is anonymous).
      // * Unnamed unions, of which there can only be one in any particular scope. In this case,
      //   the parent struct type itself is annotated.
      // So if we received `null` as the constructor parameter, check for annotations on the struct
      // type.
      for (auto anno: schemaProto.getAnnotations()) {
        switch (anno.getId()) {
          case JSON_DISCRIMINATOR_ANNOTATION_ID:
            discriminator = anno.getValue().getStruct().getAs<json::DiscriminatorOptions>();
            break;
        }
      }
    }

    KJ_IF_SOME(d, discriminator) {
      if (d.hasName()) {
        unionTagName = d.getName();
      } else {
        unionTagName = unionDeclName;
      }
      KJ_IF_SOME(u, unionTagName) {
        fieldsByName.insert(u, FieldNameInfo {
          FieldNameInfo::UNION_TAG, 0, 0, nullptr
        });
      }

      if (d.hasValueName()) {
        fieldsByName.insert(d.getValueName(), FieldNameInfo {
          FieldNameInfo::UNION_VALUE, 0, 0, nullptr
        });
      }
    }

    discriminantOffset = schemaProto.getStruct().getDiscriminantOffset();

    fields = KJ_MAP(field, schema.getFields()) {
      auto fieldProto = field.getProto();
      auto type = field.getType();
      auto fieldName = fieldProto.getName();

      FieldNameInfo nameInfo;
      nameInfo.index = field.getIndex();
      nameInfo.type = FieldNameInfo::NORMAL;
      nameInfo.prefixLength = 0;

      FieldInfo info;
      info.name = fieldName;

      kj::Maybe<json::DiscriminatorOptions::Reader> subDiscriminator;
      bool flattened = false;
      for (auto anno: field.getProto().getAnnotations()) {
        switch (anno.getId()) {
          case JSON_NAME_ANNOTATION_ID:
            info.name = anno.getValue().getText();
            break;
          case JSON_FLATTEN_ANNOTATION_ID:
            KJ_REQUIRE(type.isStruct(), "only struct types can be flattened", fieldName, typeName);
            flattened = true;
            info.prefix = anno.getValue().getStruct().getAs<json::FlattenOptions>().getPrefix();
            break;
          case JSON_DISCRIMINATOR_ANNOTATION_ID:
            KJ_REQUIRE(fieldProto.isGroup(), "only unions can have discriminator");
            subDiscriminator = anno.getValue().getStruct().getAs<json::DiscriminatorOptions>();
            break;
          case JSON_BASE64_ANNOTATION_ID: {
            KJ_REQUIRE(field.getType().isData(), "only Data can be marked for base64 encoding");
            static Base64Handler handler;
            codec.addFieldHandler(field, handler);
            break;
          }
          case JSON_HEX_ANNOTATION_ID: {
            KJ_REQUIRE(field.getType().isData(), "only Data can be marked for hex encoding");
            static HexHandler handler;
            codec.addFieldHandler(field, handler);
            break;
          }
        }
      }

      if (fieldProto.isGroup()) {
        // Load group type handler now, even if not flattened, so that we can pass its
        // `subDiscriminator`.
        kj::Maybe<kj::StringPtr> subFieldName;
        if (flattened) {
          // If the group was flattened, then we allow its field name to be used as the
          // discriminator name, so that the discriminator doesn't have to explicitly specify a
          // name.
          subFieldName = fieldName;
        }
        auto& subHandler = codec.loadAnnotatedHandler(
            type.asStruct(), subDiscriminator, subFieldName, dependencies);
        if (flattened) {
          info.flattenHandler = subHandler;
        }
      } else if (type.isStruct()) {
        if (flattened) {
          info.flattenHandler = codec.loadAnnotatedHandler(
              type.asStruct(), kj::none, kj::none, dependencies);
        }
      }

      bool isUnionMember = fieldProto.getDiscriminantValue() != schema::Field::NO_DISCRIMINANT;

      KJ_IF_SOME(fh, info.flattenHandler) {
        // Set up fieldsByName for each of the child's fields.
        for (auto& entry: fh.fieldsByName) {
          kj::StringPtr flattenedName;
          kj::String ownName;
          if (info.prefix.size() > 0) {
            ownName = kj::str(info.prefix, entry.key);
            flattenedName = ownName;
          } else {
            flattenedName = entry.key;
          }

          fieldsByName.upsert(flattenedName, FieldNameInfo {
            isUnionMember ? FieldNameInfo::FLATTENED_FROM_UNION : FieldNameInfo::FLATTENED,
            field.getIndex(), (uint)info.prefix.size(), kj::mv(ownName)
          }, [&](FieldNameInfo& existing, FieldNameInfo&& replacement) {
            KJ_REQUIRE(existing.type == FieldNameInfo::FLATTENED_FROM_UNION &&
                       replacement.type == FieldNameInfo::FLATTENED_FROM_UNION,
                "flattened members have the same name and are not mutually exclusive");
          });
        }
      }

      info.nameForDiscriminant = info.name;

      if (!flattened) {
        bool isUnionWithValueName = false;
        if (isUnionMember) {
          KJ_IF_SOME(d, discriminator) {
            if (d.hasValueName()) {
              info.name = d.getValueName();
              isUnionWithValueName = true;
            }
          }
        }

        if (!isUnionWithValueName) {
          fieldsByName.insert(info.name, kj::mv(nameInfo));
        }
      }

      if (isUnionMember) {
        unionTagValues.insert(info.nameForDiscriminant, field);
      }

      // Look for dependencies that we need to add.
      while (type.isList()) type = type.asList().getElementType();
      if (codec.impl->typeHandlers.find(type) == kj::none) {
        switch (type.which()) {
          case schema::Type::STRUCT:
            dependencies.add(type.asStruct());
            break;
          case schema::Type::ENUM:
            dependencies.add(type.asEnum());
            break;
          case schema::Type::INTERFACE:
            dependencies.add(type.asInterface());
            break;
          default:
            break;
        }
      }

      return info;
    };
  }